

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_map.c
# Opt level: O2

void nhr_map_delete(_nhr_map_node *map)

{
  _nhr_map_node_struct *p_Var1;
  
  while (map != (_nhr_map_node *)0x0) {
    p_Var1 = map->next;
    nhr_string_delete(map->key);
    if (map->value_type < 3) {
      nhr_free((map->value).data);
    }
    if (map->reserved_type < 3) {
      nhr_free((map->reserved).data);
    }
    nhr_free(map);
    map = p_Var1;
  }
  return;
}

Assistant:

void nhr_map_delete(_nhr_map_node * map) {
	_nhr_map_node *cur = map, *last;
	while (cur) {
		last = cur;
		cur = cur->next;
		nhr_string_delete(last->key);
		if (last->value_type <= NHR_MAP_VALUE_STRING) {
			nhr_free(last->value.data);
		}
        if (last->reserved_type <= NHR_MAP_VALUE_STRING) {
            nhr_free(last->reserved.data);
        }
		nhr_free(last);
	}
}